

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::AsyncPipe::tryRead
          (AsyncPipe *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  long *plVar1;
  undefined8 node;
  int iVar2;
  void *pvVar3;
  size_t in_R8;
  ArrayPtr<unsigned_char> readBuffer;
  OneOf<kj::ArrayPtr<kj::OwnFd>,_kj::ArrayPtr<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
  local_48;
  
  if (maxBytes == 0) {
    if (_ZGVZN2kj12constPromiseImTnT_Lm0EEENS_7PromiseIS1_EEvE4NODE == '\0') {
      iVar2 = __cxa_guard_acquire(&_ZGVZN2kj12constPromiseImTnT_Lm0EEENS_7PromiseIS1_EEvE4NODE);
      if (iVar2 != 0) {
        kj::_::ImmediatePromiseNodeBase::ImmediatePromiseNodeBase
                  ((ImmediatePromiseNodeBase *)
                   _ZZN2kj12constPromiseImTnT_Lm0EEENS_7PromiseIS1_EEvE4NODE);
        _ZZN2kj12constPromiseImTnT_Lm0EEENS_7PromiseIS1_EEvE4NODE._0_8_ = &PTR_destroy_006422f8;
        __cxa_atexit(kj::_::ImmediatePromiseNodeBase::~ImmediatePromiseNodeBase,
                     _ZZN2kj12constPromiseImTnT_Lm0EEENS_7PromiseIS1_EEvE4NODE,&__dso_handle);
        __cxa_guard_release(&_ZGVZN2kj12constPromiseImTnT_Lm0EEENS_7PromiseIS1_EEvE4NODE);
      }
    }
    (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
    _vptr_AsyncInputStream = (_func_int **)_ZZN2kj12constPromiseImTnT_Lm0EEENS_7PromiseIS1_EEvE4NODE
    ;
  }
  else {
    plVar1 = *(long **)((long)buffer + 0x20);
    if (plVar1 == (long *)0x0) {
      pvVar3 = operator_new(0x400);
      *(undefined8 *)((long)pvVar3 + 0x1c8) = 0;
      *(undefined8 *)((long)pvVar3 + 0x1d0) = 0;
      *(undefined ***)((long)pvVar3 + 0x1c0) = &PTR_destroy_006467c0;
      *(undefined ***)((long)pvVar3 + 0x1d8) = &PTR_reject_00646810;
      *(undefined1 *)((long)pvVar3 + 0x1e0) = 0;
      *(undefined1 *)((long)pvVar3 + 0x378) = 0;
      *(undefined1 *)((long)pvVar3 + 0x390) = 1;
      local_48._0_8_ = (ulong)(uint)local_48._4_4_ << 0x20;
      readBuffer.size_ = in_R8;
      readBuffer.ptr = (uchar *)minBytes;
      BlockedRead::BlockedRead
                ((BlockedRead *)((long)pvVar3 + 0x398),
                 (PromiseFulfiller<kj::AsyncCapabilityStream::ReadResult> *)((long)pvVar3 + 0x1d8),
                 (AsyncPipe *)buffer,readBuffer,maxBytes,&local_48);
      *(void **)((long)pvVar3 + 0x1c8) = pvVar3;
      *(undefined8 *)((long)pvVar3 + 0x1c8) = 0;
      local_48._0_8_ = (PromiseArenaMember *)((long)pvVar3 + 0x1c0);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)((long)pvVar3 + 0x198),(OwnPromiseNode *)&local_48,
                 kj::_::
                 SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:247:17)>
                 ::anon_class_1_0_00000001_for_func::operator());
      node = local_48._0_8_;
      *(undefined ***)((long)pvVar3 + 0x198) = &PTR_destroy_00646a80;
      *(void **)((long)pvVar3 + 0x1a0) = pvVar3;
      (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
      _vptr_AsyncInputStream = (_func_int **)((long)pvVar3 + 0x198);
      if ((PromiseArenaMember *)local_48._0_8_ != (PromiseArenaMember *)0x0) {
        local_48.tag = 0;
        local_48._4_4_ = 0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
      }
    }
    else {
      (**(code **)(*plVar1 + 8))(this,plVar1,minBytes,maxBytes);
    }
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    if (minBytes == 0) {
      return constPromise<size_t, 0>();
    } else KJ_IF_SOME(s, state) {
      return s.tryRead(buffer, minBytes, maxBytes);
    } else {
      return newAdaptedPromise<ReadResult, BlockedRead>(
          *this, arrayPtr(reinterpret_cast<byte*>(buffer), maxBytes), minBytes)
          .then([](ReadResult r) { return r.byteCount; });
    }